

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svg2png.cpp
# Opt level: O1

bool setup(int argc,char **argv,string *filename,uint32_t *width,uint32_t *height,uint32_t *bgColor)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  bool bVar5;
  stringstream ss;
  long local_1b8 [2];
  long local_1a8;
  uint auStack_1a0 [2];
  byte abStack_198 [8];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  bVar5 = 1 < argc;
  if (1 < argc) {
    pcVar1 = argv[1];
    pcVar2 = (char *)filename->_M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)filename,0,pcVar2,(ulong)pcVar1);
  }
  if (argc < 3) {
LAB_0010ab0a:
    if (3 < argc) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xffffffb5 | 8;
      pcVar1 = argv[3];
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)(ostream *)&local_1a8 + (int)*(undefined8 *)(local_1a8 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar1,sVar4);
      }
      *(uint *)((long)auStack_1a0 + *(long *)(local_1b8[0] + -0x18)) =
           *(uint *)((long)auStack_1a0 + *(long *)(local_1b8[0] + -0x18)) & 0xffffffb5 | 8;
      std::istream::_M_extract<unsigned_int>((uint *)local_1b8);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    pcVar1 = argv[2];
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)(ostream *)&local_1a8 + (int)*(undefined8 *)(local_1a8 + -0x18));
    }
    else {
      sVar4 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar1,sVar4);
    }
    std::istream::_M_extract<unsigned_int>((uint *)local_1b8);
    if ((abStack_198[*(long *)(local_1b8[0] + -0x18)] & 5) == 0) {
      iVar3 = std::istream::get();
      if (iVar3 == 0x78) {
        std::istream::_M_extract<unsigned_int>((uint *)local_1b8);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
        goto LAB_0010ab0a;
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool setup(int argc, char** argv, std::string& filename, std::uint32_t& width, std::uint32_t& height, std::uint32_t& bgColor)
{
    if(argc > 1) filename.assign(argv[1]);
    if(argc > 2) {
        std::stringstream ss;
        ss << argv[2];
        ss >> width;

        if(ss.fail() || ss.get() != 'x')
            return false;
        ss >> height;
    }

    if(argc > 3) {
        std::stringstream ss;
        ss << std::hex << argv[3];
        ss >> std::hex >> bgColor;
    }

    return argc > 1;
}